

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

RSAPrimeDetails *
setup_rsa_prime(RSAPrimeDetails *__return_storage_ptr__,int bits,_Bool strong,
               PrimeGenerationContext *pgc,ProgressReceiver *prog)

{
  ProgressPhase PVar1;
  int iVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  
  uVar3 = CONCAT71(in_register_00000011,strong);
  __return_storage_ptr__->bits = bits;
  if ((int)uVar3 != 0) {
    iVar2 = (bits - (bits + -0x21 >> 0x1f)) + -0x21 >> 1;
    __return_storage_ptr__->bitsm1 = iVar2;
    __return_storage_ptr__->bitsp1 = (bits + -0x21) - iVar2;
    __return_storage_ptr__->bitsm1m1 = (iVar2 - (iVar2 + -0x21 >> 0x1f)) + -0x21 >> 1;
    uVar3 = (ulong)(0xe6 < bits && strong);
  }
  __return_storage_ptr__->strong = SUB81(uVar3,0);
  if (SUB81(uVar3,0) != false) {
    PVar1 = (*pgc->vt->add_progress_phase)(pgc->vt,prog,__return_storage_ptr__->bitsm1m1);
    (__return_storage_ptr__->phase_m1m1).p = (void *)PVar1;
    PVar1 = (*pgc->vt->add_progress_phase)(pgc->vt,prog,__return_storage_ptr__->bitsm1);
    (__return_storage_ptr__->phase_m1).p = (void *)PVar1;
    PVar1 = (*pgc->vt->add_progress_phase)(pgc->vt,prog,__return_storage_ptr__->bitsp1);
    (__return_storage_ptr__->phase_p1).p = (void *)PVar1;
  }
  PVar1 = (*pgc->vt->add_progress_phase)(pgc->vt,prog,bits);
  (__return_storage_ptr__->phase_main).p = (void *)PVar1;
  return __return_storage_ptr__;
}

Assistant:

static RSAPrimeDetails setup_rsa_prime(
    int bits, bool strong, PrimeGenerationContext *pgc, ProgressReceiver *prog)
{
    RSAPrimeDetails pd;
    pd.bits = bits;
    if (strong) {
        pd.bitsm1 = (bits - STRONG_MARGIN) / 2;
        pd.bitsp1 = (bits - STRONG_MARGIN) - pd.bitsm1;
        pd.bitsm1m1 = (pd.bitsm1 - STRONG_MARGIN) / 2;
        if (pd.bitsm1m1 < STRONG_MARGIN) {
            /* Absurdly small prime, but we should at least not crash. */
            strong = false;
        }
    }
    pd.strong = strong;

    if (pd.strong) {
        pd.phase_m1m1 = primegen_add_progress_phase(pgc, prog, pd.bitsm1m1);
        pd.phase_m1 = primegen_add_progress_phase(pgc, prog, pd.bitsm1);
        pd.phase_p1 = primegen_add_progress_phase(pgc, prog, pd.bitsp1);
    }
    pd.phase_main = primegen_add_progress_phase(pgc, prog, pd.bits);

    return pd;
}